

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::printAtomicRMWOp(PrintExpressionContents *this,AtomicRMWOp op)

{
  if (op < (RMWXor|RMWAnd)) {
    std::operator<<(this->o,&DAT_00e241dc + *(int *)(&DAT_00e241dc + (ulong)op * 4));
    return;
  }
  handle_unreachable("unexpected rmw op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                     ,0x2b7);
}

Assistant:

void printAtomicRMWOp(AtomicRMWOp op) {
    switch (op) {
      case RMWAdd:
        o << "add";
        return;
      case RMWSub:
        o << "sub";
        return;
      case RMWAnd:
        o << "and";
        return;
      case RMWOr:
        o << "or";
        return;
      case RMWXor:
        o << "xor";
        return;
      case RMWXchg:
        o << "xchg";
        return;
    }
    WASM_UNREACHABLE("unexpected rmw op");
  }